

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O0

void __thiscall FileSystemForJUnitTestOutputTests::clear(FileSystemForJUnitTestOutputTests *this)

{
  FileForJUnitOutputTests *this_00;
  FileForJUnitOutputTests *pFVar1;
  FileForJUnitOutputTests *fileToBeDeleted;
  FileSystemForJUnitTestOutputTests *this_local;
  
  while (this->firstFile_ != (FileForJUnitOutputTests *)0x0) {
    this_00 = this->firstFile_;
    pFVar1 = FileForJUnitOutputTests::nextFile(this->firstFile_);
    this->firstFile_ = pFVar1;
    if (this_00 != (FileForJUnitOutputTests *)0x0) {
      FileForJUnitOutputTests::~FileForJUnitOutputTests(this_00);
      operator_delete(this_00,0x50);
    }
  }
  return;
}

Assistant:

void clear(void)
    {
        while (firstFile_) {
            FileForJUnitOutputTests* fileToBeDeleted = firstFile_;
            firstFile_ = firstFile_->nextFile();
            delete fileToBeDeleted;
        }
    }